

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)

{
  ImGuiDockContext *this;
  int *piVar1;
  byte *pbVar2;
  ImGuiDockNode *src_node;
  ImGuiDockNode *pIVar3;
  ImGuiDockRequest *pIVar4;
  ImGuiContext *ctx;
  ImGuiDockNode *dst_node;
  long lVar5;
  void *__dest;
  ImGuiWindowSettings *p;
  ushort uVar6;
  int iVar7;
  ImGuiDockNode *pIVar8;
  ushort uVar9;
  long lVar10;
  bool bVar11;
  long lVar12;
  int iVar13;
  ImVector<ImGuiDockNode_*> nodes_to_remove;
  int local_58;
  int iStack_54;
  void *pvStack_50;
  
  ctx = GImGui;
  this = &GImGui->DockContext;
  if (root_id == 0) {
    dst_node = (ImGuiDockNode *)0x0;
  }
  else {
    dst_node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&this->Nodes,root_id);
  }
  if (root_id == 0 || dst_node != (ImGuiDockNode *)0x0) {
    if (dst_node == (ImGuiDockNode *)0x0) {
      uVar6 = 0;
      uVar9 = 0;
    }
    else {
      uVar6 = *(ushort *)&dst_node->field_0xb8 & 7;
      uVar9 = *(ushort *)&dst_node->field_0xb8 & 0x38;
    }
    local_58 = 0;
    iStack_54 = 0;
    pvStack_50 = (void *)0x0;
    if ((this->Nodes).Data.Size < 1) {
      bVar11 = false;
    }
    else {
      lVar12 = 0;
      bVar11 = false;
      do {
        src_node = (ImGuiDockNode *)(ctx->DockContext).Nodes.Data.Data[lVar12].field_1.val_p;
        if (src_node != (ImGuiDockNode *)0x0) {
          if (root_id == 0) {
LAB_0013b84b:
            if ((src_node->LocalFlags & 0x800) != 0) {
              bVar11 = true;
            }
            if ((root_id != 0) && (lVar5 = (long)(ctx->DockContext).Requests.Size, 0 < lVar5)) {
              pIVar4 = (ctx->DockContext).Requests.Data;
              lVar10 = 0;
              do {
                if (*(ImGuiDockNode **)((long)&pIVar4->DockTargetNode + lVar10) == src_node) {
                  *(undefined4 *)((long)&pIVar4->Type + lVar10) = 0;
                }
                lVar10 = lVar10 + 0x40;
              } while (lVar5 * 0x40 != lVar10);
            }
            if (dst_node != (ImGuiDockNode *)0x0) {
              DockNodeMoveWindows(dst_node,src_node);
            }
            __dest = pvStack_50;
            if (local_58 == iStack_54) {
              if (iStack_54 == 0) {
                iVar7 = 8;
              }
              else {
                iVar7 = iStack_54 / 2 + iStack_54;
              }
              iVar13 = local_58 + 1;
              if (local_58 + 1 < iVar7) {
                iVar13 = iVar7;
              }
              if (iStack_54 < iVar13) {
                if (GImGui != (ImGuiContext *)0x0) {
                  piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar1 = *piVar1 + 1;
                }
                __dest = (*GImAllocatorAllocFunc)((long)iVar13 << 3,GImAllocatorUserData);
                iStack_54 = iVar13;
                if (pvStack_50 != (void *)0x0) {
                  memcpy(__dest,pvStack_50,(long)local_58 << 3);
                  if ((pvStack_50 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar1 = *piVar1 + -1;
                  }
                  (*GImAllocatorFreeFunc)(pvStack_50,GImAllocatorUserData);
                }
              }
            }
            pvStack_50 = __dest;
            *(ImGuiDockNode **)((long)pvStack_50 + (long)local_58 * 8) = src_node;
            local_58 = local_58 + 1;
          }
          else {
            pIVar3 = src_node;
            if (src_node->ID != root_id) {
              do {
                pIVar8 = pIVar3;
                pIVar3 = pIVar8->ParentNode;
              } while (pIVar3 != (ImGuiDockNode *)0x0);
              if (pIVar8->ID == root_id) goto LAB_0013b84b;
            }
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (this->Nodes).Data.Size);
    }
    if (dst_node != (ImGuiDockNode *)0x0) {
      *(ushort *)&dst_node->field_0xb8 =
           uVar9 | uVar6 | (ushort)*(undefined4 *)&dst_node->field_0xb8 & 0xffc0;
    }
    p = (ImGuiWindowSettings *)(ctx->SettingsWindows).Buf.Data;
    if (p != (ImGuiWindowSettings *)0x0) {
      p = (ImGuiWindowSettings *)&p->Pos;
    }
    for (; p != (ImGuiWindowSettings *)0x0;
        p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,p)) {
      if ((p->DockId != 0) && (0 < (long)local_58)) {
        lVar12 = 0;
        do {
          if (**(ImGuiID **)((long)pvStack_50 + lVar12 * 8) == p->DockId) {
            p->DockId = root_id;
            break;
          }
          lVar12 = lVar12 + 1;
        } while (local_58 != lVar12);
      }
    }
    if (1 < (long)local_58) {
      qsort(pvStack_50,(long)local_58,8,DockNodeComparerDepthMostFirst);
    }
    if (0 < local_58) {
      lVar12 = 0;
      do {
        DockContextRemoveNode(ctx,*(ImGuiDockNode **)((long)pvStack_50 + lVar12 * 8),false);
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_58);
    }
    if (root_id == 0) {
      ImGuiStorage::Clear(&this->Nodes);
      pIVar4 = (ctx->DockContext).Requests.Data;
      if (pIVar4 != (ImGuiDockRequest *)0x0) {
        (ctx->DockContext).Requests.Size = 0;
        (ctx->DockContext).Requests.Capacity = 0;
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        (ctx->DockContext).Requests.Data = (ImGuiDockRequest *)0x0;
      }
    }
    else if (bVar11) {
      pbVar2 = (byte *)((long)&dst_node->LocalFlags + 1);
      *pbVar2 = *pbVar2 | 8;
      dst_node->CentralNode = dst_node;
    }
    if (pvStack_50 != (void *)0x0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pvStack_50,GImAllocatorUserData);
    }
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockContext* dc  = &ctx->DockContext;

    ImGuiDockNode* root_node = root_id ? DockContextFindNodeByID(ctx, root_id) : NULL;
    if (root_id && root_node == NULL)
        return;
    bool has_central_node = false;

    ImGuiDataAuthority backup_root_node_authority_for_pos = root_node ? root_node->AuthorityForPos : ImGuiDataAuthority_Auto;
    ImGuiDataAuthority backup_root_node_authority_for_size = root_node ? root_node->AuthorityForSize : ImGuiDataAuthority_Auto;

    // Process active windows
    ImVector<ImGuiDockNode*> nodes_to_remove;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
        {
            bool want_removal = (root_id == 0) || (node->ID != root_id && DockNodeGetRootNode(node)->ID == root_id);
            if (want_removal)
            {
                if (node->IsCentralNode())
                    has_central_node = true;
                if (root_id != 0)
                    DockContextQueueNotifyRemovedNode(ctx, node);
                if (root_node)
                    DockNodeMoveWindows(root_node, node);
                nodes_to_remove.push_back(node);
            }
        }

    // DockNodeMoveWindows->DockNodeAddWindow will normally set those when reaching two windows (which is only adequate during interactive merge)
    // Make sure we don't lose our current pos/size. (FIXME-DOCK: Consider tidying up that code in DockNodeAddWindow instead)
    if (root_node)
    {
        root_node->AuthorityForPos = backup_root_node_authority_for_pos;
        root_node->AuthorityForSize = backup_root_node_authority_for_size;
    }

    // Apply to settings
    for (ImGuiWindowSettings* settings = ctx->SettingsWindows.begin(); settings != NULL; settings = ctx->SettingsWindows.next_chunk(settings))
        if (ImGuiID window_settings_dock_id = settings->DockId)
            for (int n = 0; n < nodes_to_remove.Size; n++)
                if (nodes_to_remove[n]->ID == window_settings_dock_id)
                {
                    settings->DockId = root_id;
                    break;
                }

    // Not really efficient, but easier to destroy a whole hierarchy considering DockContextRemoveNode is attempting to merge nodes
    if (nodes_to_remove.Size > 1)
        ImQsort(nodes_to_remove.Data, nodes_to_remove.Size, sizeof(ImGuiDockNode*), DockNodeComparerDepthMostFirst);
    for (int n = 0; n < nodes_to_remove.Size; n++)
        DockContextRemoveNode(ctx, nodes_to_remove[n], false);

    if (root_id == 0)
    {
        dc->Nodes.Clear();
        dc->Requests.clear();
    }
    else if (has_central_node)
    {
        root_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
        root_node->CentralNode = root_node;
    }
}